

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MP1Node.cpp
# Opt level: O3

void __thiscall MP1Node::sendMembershipList(MP1Node *this,Address *to,MsgTypes msgType)

{
  MemberListEntry *pMVar1;
  int iVar2;
  long lVar3;
  MsgTypes *data;
  iterator __position;
  Member *pMVar4;
  long lVar5;
  byte *pbVar6;
  Address toAddr;
  Address local_40;
  Address *local_38;
  
  local_38 = to;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"start sendMembershipList ...",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  pMVar4 = this->memberNode;
  __position._M_current =
       (pMVar4->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>.
       _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (pMVar4->memberList).
           super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar3 = (long)pMVar1 - (long)__position._M_current >> 3;
  lVar5 = lVar3 * -0x5555555555555555;
  data = (MsgTypes *)malloc(lVar3 * 0x555555555555555a + 0x12);
  *data = msgType;
  data[1] = *(MsgTypes *)(pMVar4->addr).addr;
  *(undefined2 *)(data + 2) = *(undefined2 *)((pMVar4->addr).addr + 4);
  *(long *)((long)data + 10) = lVar5;
  if (pMVar1 != __position._M_current) {
    pbVar6 = (byte *)((long)data + 0x12);
    do {
      if (__position._M_current ==
          (pMVar4->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>
          ._M_impl.super__Vector_impl_data._M_start) {
LAB_001068ff:
        *(int *)pbVar6 = (__position._M_current)->id;
        *(short *)(pbVar6 + 4) = (__position._M_current)->port;
        *(long *)(pbVar6 + 6) = (__position._M_current)->heartbeat;
        pbVar6 = pbVar6 + 0xe;
        __position._M_current = __position._M_current + 1;
      }
      else {
        iVar2 = Params::getcurrtime(this->par);
        if ((long)iVar2 - (__position._M_current)->timestamp < 0x15) {
          iVar2 = Params::getcurrtime(this->par);
          if ((long)iVar2 - (__position._M_current)->timestamp < 6) {
            pMVar4 = this->memberNode;
            goto LAB_001068ff;
          }
          __position._M_current = __position._M_current + 1;
        }
        else {
          local_40.addr._0_4_ = (__position._M_current)->id;
          local_40.addr._4_2_ = (__position._M_current)->port;
          Log::logNodeRemove(this->log,&this->memberNode->addr,&local_40);
          __position = std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::_M_erase
                                 (&this->memberNode->memberList,__position);
        }
        lVar5 = lVar5 + -1;
        pMVar4 = this->memberNode;
      }
    } while (__position._M_current !=
             (pMVar4->memberList).
             super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  *(long *)((long)data + 10) = lVar5;
  EmulNet::ENsend(this->emulNet,&pMVar4->addr,local_38,(char *)data,(int)lVar5 * 0xe + 0x12);
  free(data);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"...end sendMembershipList.",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return;
}

Assistant:

void MP1Node::sendMembershipList(Address *to, enum MsgTypes msgType) {
    cout << "start sendMembershipList ..." << endl;

    long numberOfMembers = memberNode->memberList.size();
    //message structure: [MessageHdr] [Address] [Number of members] [Members...]
    size_t msgsize = sizeof(MessageHdr) + sizeof(memberNode->addr.addr) + sizeof(long) + (numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)));

    //malloc memory space for the header
    MessageHdr* msg = (MessageHdr *) malloc(msgsize * sizeof(char));

    //msg will be a pointer to an address
    char* data = (char*) (msg + 1);

    //set the message type
    msg->msgType = msgType;

    //set this node's address into the message
    memcpy(data, &memberNode->addr.addr, sizeof(memberNode->addr.addr));
    data += sizeof(memberNode->addr.addr);

    //set the number of members (for now)
    char* numberOfMembersPtr = data;
    memcpy(numberOfMembersPtr, &numberOfMembers, sizeof(long));
    data += sizeof(long);

    //set the members in list and delete members that have failed
    for (vector<MemberListEntry>::iterator entry = memberNode->memberList.begin(); entry != memberNode->memberList.end();) {
        if (entry != memberNode->memberList.begin()) {
            if (par->getcurrtime() - entry->timestamp > TREMOVE) {
#ifdef DEBUGLOG
                Address toAddr;
                memcpy(&toAddr.addr[0], &entry->id, sizeof(int));
                memcpy(&toAddr.addr[4], &entry->port, sizeof(short));
                log->logNodeRemove(&memberNode->addr, &toAddr);
#endif
                entry = memberNode->memberList.erase(entry);
                numberOfMembers--;
                continue;
            }
            //dont copy the failed not into the data
            if (par->getcurrtime() - entry->timestamp > TFAIL) {
                numberOfMembers--;
                ++entry;
                continue;
            }
        }

        memcpy(data, &entry->id, sizeof(int));
        data += sizeof(int);
        memcpy(data, &entry->port, sizeof(short));
        data += sizeof(short);
        memcpy(data, &entry->heartbeat, sizeof(long));
        data += sizeof(long);

        ++entry;
    }

    //set new number of members members were deleted
    memcpy(numberOfMembersPtr, &numberOfMembers, sizeof(long));

    //read new message size in case members were deleted
    msgsize = sizeof(MessageHdr) + sizeof(memberNode->addr.addr) + sizeof(long) + (numberOfMembers * (sizeof(int) + sizeof(short) + sizeof(log)));

    //send membership list through network
    emulNet->ENsend(&memberNode->addr, to, (char *)msg, msgsize);   //send the membership list to network
    free(msg);

    cout << "...end sendMembershipList." << endl;
}